

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GetTextureSubImage::Functional::iterate(Functional *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  ContextInfo *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar4;
  uint local_200;
  GLuint i_1;
  GLuint compressed_targets_count;
  GLenum compressed_targets [4];
  uint local_1e0;
  GLuint i;
  GLuint targets_count;
  GLenum targets [8];
  MessageBuilder local_1a0;
  byte local_1d;
  deUint32 local_1c;
  ApiType AStack_18;
  bool is_arb_get_texture_sub_image;
  byte local_13;
  byte local_12;
  byte local_11;
  bool is_at_least_gl_45;
  bool test_error;
  Functional *pFStack_10;
  bool is_ok;
  Functional *this_local;
  
  local_11 = 1;
  local_12 = 0;
  pFStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  AStack_18.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::core(4,5);
  local_13 = glu::contextSupports((ContextType)AStack_18.m_bits,(ApiType)local_1c);
  this_00 = deqp::Context::getContextInfo(this->m_context);
  local_1d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_get_texture_sub_image");
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[7])(pRVar3,"glGetCompressedTextureSubImage");
  this->m_gl_GetCompressedTextureSubImage =
       (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[7])();
  this->m_gl_GetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_00,iVar2);
  if ((this->m_gl_GetCompressedTextureSubImage != (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)0x0) &&
     (this->m_gl_GetTextureSubImage != (PFNGLGETTEXTURESUBIMAGEPROC)0x0)) {
    if (((local_13 & 1) != 0) || ((local_1d & 1) != 0)) {
      _i = 0x8c1800000de0;
      targets[0] = 0xde1;
      targets[1] = 0x84f5;
      targets[2] = 0x8513;
      targets[3] = 0x9009;
      targets[4] = 0x8c1a;
      targets[5] = 0x806f;
      for (local_1e0 = 0; local_1e0 < 8; local_1e0 = local_1e0 + 1) {
        prepare(this,(&i)[local_1e0],false);
        bVar1 = check(this,(&i)[local_1e0],false);
        local_11 = bVar1 & local_11;
        clean(this);
      }
      _i_1 = 0x851300000de1;
      compressed_targets[0] = 0x9009;
      compressed_targets[1] = 0x8c1a;
      for (local_200 = 0; local_200 < 4; local_200 = local_200 + 1) {
        prepare(this,(&i_1)[local_200],true);
        bVar1 = check(this,(&i_1)[local_200],true);
        local_11 = bVar1 & local_11;
        clean(this);
      }
    }
    if ((local_11 & 1) == 0) {
      if ((local_12 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    return STOP;
  }
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_1a0,
                       (char (*) [87])
                       "Cannot obtain glGetCompressedTextureSubImage or glGetTextureSubImage function pointer."
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

tcu::TestNode::IterateResult gl4cts::GetTextureSubImage::Functional::iterate(void)
{
	bool is_ok		= true;
	bool test_error = false;

	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_get_texture_sub_image = m_context.getContextInfo().isExtensionSupported("GL_ARB_get_texture_sub_image");

	/* Bind function pointers. */
	m_gl_GetCompressedTextureSubImage =
		(PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress(
			"glGetCompressedTextureSubImage");
	m_gl_GetTextureSubImage =
		(PFNGLGETTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress("glGetTextureSubImage");

	try
	{
		/* Report error when function pointers are not available. */
		if ((DE_NULL == m_gl_GetCompressedTextureSubImage) || (DE_NULL == m_gl_GetTextureSubImage))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Cannot obtain glGetCompressedTextureSubImage or glGetTextureSubImage function pointer."
				<< tcu::TestLog::EndMessage;
			throw 0;
		}

		/* Run tests. */
		if (is_at_least_gl_45 || is_arb_get_texture_sub_image)
		{
			/* Tested targets. */
			glw::GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D,
									  GL_TEXTURE_RECTANGLE, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_CUBE_MAP_ARRAY,
									  GL_TEXTURE_2D_ARRAY,  GL_TEXTURE_3D };

			glw::GLuint targets_count = sizeof(targets) / sizeof(targets[0]);

			for (glw::GLuint i = 0; i < targets_count; ++i)
			{
				prepare(targets[i], false);

				is_ok &= check(targets[i], false);

				clean();
			}

			/* Compressed textures tested targets. */
			glw::GLenum compressed_targets[] = { GL_TEXTURE_2D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_CUBE_MAP_ARRAY,
												 GL_TEXTURE_2D_ARRAY };

			glw::GLuint compressed_targets_count = sizeof(compressed_targets) / sizeof(compressed_targets[0]);

			for (glw::GLuint i = 0; i < compressed_targets_count; ++i)
			{
				prepare(compressed_targets[i], true);

				is_ok &= check(compressed_targets[i], true);

				clean();
			}
		}
	}
	catch (...)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test error has occured." << tcu::TestLog::EndMessage;

		is_ok	  = false;
		test_error = true;

		clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}